

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

PSymbol * __thiscall
PSymbolTable::FindSymbolInTable(PSymbolTable *this,FName *symname,PSymbolTable **symtable)

{
  PSymbolTable *this_00;
  FName local_38;
  FName local_34;
  PSymbol **local_30;
  PSymbol **value;
  PSymbolTable **symtable_local;
  FName *symname_local;
  PSymbolTable *this_local;
  
  value = (PSymbol **)symtable;
  symtable_local = (PSymbolTable **)symname;
  symname_local = (FName *)this;
  FName::FName(&local_34,symname);
  local_30 = TMap<FName,_PSymbol_*,_THashTraits<FName>,_TValueTraits<PSymbol_*>_>::CheckKey
                       (&this->Symbols,&local_34);
  if (local_30 == (PSymbol **)0x0) {
    if (this->ParentSymbolTable == (PSymbolTable *)0x0) {
      *value = (PSymbol *)0x0;
      this_local = (PSymbolTable *)0x0;
    }
    else {
      this_00 = this->ParentSymbolTable;
      FName::FName(&local_38,symname);
      this_local = (PSymbolTable *)FindSymbolInTable(this_00,&local_38,(PSymbolTable **)value);
    }
  }
  else {
    *value = (PSymbol *)this;
    this_local = (PSymbolTable *)*local_30;
  }
  return (PSymbol *)this_local;
}

Assistant:

PSymbol *PSymbolTable::FindSymbolInTable(FName symname, PSymbolTable *&symtable)
{
	PSymbol * const *value = Symbols.CheckKey(symname);
	if (value == NULL)
	{
		if (ParentSymbolTable != NULL)
		{
			return ParentSymbolTable->FindSymbolInTable(symname, symtable);
		}
		symtable = NULL;
		return NULL;
	}
	symtable = this;
	return *value;
}